

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  element_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<testing::internal::ExpectationBase> *an_expectation_base;
  Expectation EVar2;
  allocator<char> local_31;
  string local_30;
  
  an_expectation_base =
       *(shared_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8);
  do {
    if (an_expectation_base ==
        *(shared_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Cannot find expectation.",&local_31);
      Assert(false,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/googletest/googlemock/src/gmock-spec-builders.cc"
             ,0x204,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      Expectation::Expectation((Expectation *)this);
      _Var1._M_pi = extraout_RDX;
LAB_00111af8:
      EVar2.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = _Var1._M_pi;
      EVar2.expectation_base_.
      super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (Expectation)
             EVar2.expectation_base_.
             super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    }
    if ((an_expectation_base->
        super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == in_RDX) {
      Expectation::Expectation((Expectation *)this,an_expectation_base);
      _Var1._M_pi = extraout_RDX_00;
      goto LAB_00111af8;
    }
    an_expectation_base = an_expectation_base + 1;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}